

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

bool boost::ext::ut::v1_1_8::detail::
     on<boost::ext::ut::v1_1_8::detail::eq_<unsigned_long,boost::ext::ut::v1_1_8::detail::integral_constant<0ul>>,boost::ext::ut::v1_1_8::events::assertion<boost::ext::ut::v1_1_8::detail::eq_<unsigned_long,boost::ext::ut::v1_1_8::detail::integral_constant<0ul>>>>
               (assertion<boost::ext::ut::v1_1_8::detail::eq_<unsigned_long,_boost::ext::ut::v1_1_8::detail::integral_constant<0UL>_>_>
                *event)

{
  undefined8 uVar1;
  assertion_fail<boost::ext::ut::v1_1_8::detail::eq_<unsigned_long,_boost::ext::ut::v1_1_8::detail::integral_constant<0UL>_>_>
  assertion;
  bool bVar2;
  undefined2 uStack_32;
  undefined6 uStack_30;
  undefined2 uStack_2a;
  undefined6 uStack_16;
  undefined4 uStack_4;
  
  bVar2 = true;
  uVar1 = *(undefined8 *)((long)&(event->location).file_ + 2);
  uStack_32 = (undefined2)((ulong)*(undefined8 *)&(event->expr).field_0xa >> 0x30);
  uStack_30 = (undefined6)uVar1;
  uStack_2a = (undefined2)((ulong)uVar1 >> 0x30);
  if (cfg<boost::ext::ut::v1_1_8::override>[0x348] == '\0') {
    if (((event->expr).value_ & 1U) == 0) {
      assertion.location.file_._2_6_ = uStack_30;
      assertion.location.file_._0_2_ = uStack_32;
      cfg<boost::ext::ut::v1_1_8::override>._528_8_ =
           cfg<boost::ext::ut::v1_1_8::override>._528_8_ + 1;
      assertion.location.line_._2_2_ = *(undefined2 *)((long)&(event->location).line_ + 2);
      assertion.location.line_._0_2_ = uStack_2a;
      assertion.expr._10_6_ = uStack_16;
      assertion.expr._8_1_ = (event->expr).field_0x8;
      assertion.expr.value_ = (event->expr).value_;
      assertion.location._12_4_ = uStack_4;
      assertion.expr.lhs_ = (event->expr).lhs_;
      reporter<boost::ext::ut::v1_1_8::printer>::
      on<boost::ext::ut::v1_1_8::detail::eq_<unsigned_long,boost::ext::ut::v1_1_8::detail::integral_constant<0ul>>>
                ((reporter<boost::ext::ut::v1_1_8::printer> *)cfg<boost::ext::ut::v1_1_8::override>,
                 assertion);
      bVar2 = false;
    }
    else {
      cfg<boost::ext::ut::v1_1_8::override>._24_8_ =
           cfg<boost::ext::ut::v1_1_8::override>._24_8_ + 1;
    }
  }
  return bVar2;
}

Assistant:

[[nodiscard]] constexpr decltype(auto) on(TEvent&& event) {
  return ut::cfg<typename type_traits::identity<override, Ts...>::type>.on(
      static_cast<TEvent&&>(event));
}